

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void kj::_::Debug::
     log<char_const(&)[63],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [63],
               DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
               *params_1,TestEnum_9c8e9318b29d9cd3 *params_2,TestEnum_9c8e9318b29d9cd3 *params_3)

{
  undefined4 in_register_00000014;
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  *params_00;
  TestEnum_9c8e9318b29d9cd3 *params_01;
  TestEnum_9c8e9318b29d9cd3 *params_02;
  ArrayPtr<kj::String> AVar1;
  ArrayPtr<kj::String> in_stack_fffffffffffffed8;
  ArrayDisposer **local_f0;
  undefined1 local_98 [8];
  String argValues [4];
  DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
  *params_local_1;
  char (*params_local) [63];
  char *macroArgs_local;
  LogSeverity severity_local;
  int line_local;
  char *file_local;
  
  str<char_const(&)[63]>
            ((String *)local_98,(kj *)params,(char (*) [63])CONCAT44(in_register_00000014,severity))
  ;
  str<kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&>
            ((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<capnp::schemas::TestEnum_9c8e9318b29d9cd3&>
            ((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<capnp::schemas::TestEnum_9c8e9318b29d9cd3&>
            ((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  AVar1 = arrayPtr<kj::String>((String *)local_98,4);
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)AVar1.ptr,in_stack_fffffffffffffed8);
  local_f0 = &argValues[3].content.disposer;
  do {
    local_f0 = local_f0 + -3;
    String::~String((String *)local_f0);
  } while (local_f0 != (ArrayDisposer **)local_98);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}